

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGeometryUtil.cpp
# Opt level: O2

void cbtGeometryUtil::getVerticesFromPlaneEquations
               (cbtAlignedObjectArray<cbtVector3> *planeEquations,
               cbtAlignedObjectArray<cbtVector3> *verticesOut)

{
  cbtVector3 *v;
  uint uVar1;
  cbtVector3 *pcVar2;
  float fVar3;
  undefined1 auVar4 [16];
  cbtVector3 cVar5;
  cbtVector3 cVar6;
  bool bVar7;
  cbtVector3 *v_00;
  cbtVector3 *this;
  uint uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float fVar19;
  cbtVector3 cVar20;
  uint local_b0;
  cbtVector3 local_a0;
  cbtVector3 local_90;
  cbtVector3 local_80;
  uint local_6c;
  cbtVector3 local_68;
  long local_58;
  ulong local_50;
  ulong local_48;
  cbtAlignedObjectArray<cbtVector3> *local_40;
  long local_38;
  
  uVar1 = planeEquations->m_size;
  local_50 = (ulong)(~((int)uVar1 >> 0x1f) & uVar1);
  local_b0 = 2;
  local_58 = 1;
  local_40 = verticesOut;
  for (local_48 = 0; local_48 != local_50; local_48 = local_48 + 1) {
    v_00 = planeEquations->m_data + local_48;
    uVar8 = local_b0;
    for (local_38 = local_58; (int)local_38 < (int)uVar1; local_38 = local_38 + 1) {
      lVar9 = (ulong)uVar8 << 4;
      this = planeEquations->m_data + local_38;
      local_6c = uVar8;
      while( true ) {
        auVar18 = in_ZMM1._8_56_;
        auVar15 = in_ZMM0._8_56_;
        if ((int)uVar1 <= (int)uVar8) break;
        pcVar2 = planeEquations->m_data;
        v = (cbtVector3 *)((long)pcVar2->m_floats + lVar9);
        cVar20 = cbtVector3::cross(this,v);
        auVar16._0_8_ = cVar20.m_floats._8_8_;
        auVar16._8_56_ = auVar18;
        auVar12._0_8_ = cVar20.m_floats._0_8_;
        auVar12._8_56_ = auVar15;
        local_a0.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar12._0_16_,auVar16._0_16_);
        auVar15 = ZEXT856(local_a0.m_floats._8_8_);
        cVar20 = cbtVector3::cross(v,v_00);
        auVar17._0_8_ = cVar20.m_floats._8_8_;
        auVar17._8_56_ = auVar18;
        auVar13._0_8_ = cVar20.m_floats._0_8_;
        auVar13._8_56_ = auVar15;
        local_80.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar13._0_16_,auVar17._0_16_);
        auVar15 = ZEXT856(local_80.m_floats._8_8_);
        cVar20 = cbtVector3::cross(v_00,this);
        in_ZMM1._0_8_ = cVar20.m_floats._8_8_;
        in_ZMM1._8_56_ = auVar18;
        auVar14._0_8_ = cVar20.m_floats._0_8_;
        auVar14._8_56_ = auVar15;
        local_90.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar14._0_16_,in_ZMM1._0_16_);
        in_ZMM0._0_4_ = cbtVector3::length2(&local_a0);
        in_ZMM0._4_60_ = extraout_var;
        if (0.0001 < in_ZMM0._0_4_) {
          in_ZMM0._0_4_ = cbtVector3::length2(&local_80);
          in_ZMM0._4_60_ = extraout_var_00;
          if (0.0001 < in_ZMM0._0_4_) {
            in_ZMM0._0_4_ = cbtVector3::length2(&local_90);
            cVar6.m_floats = local_80.m_floats;
            cVar5.m_floats = local_90.m_floats;
            cVar20.m_floats = local_a0.m_floats;
            in_ZMM0._4_60_ = extraout_var_01;
            if (0.0001 < in_ZMM0._0_4_) {
              in_ZMM0 = ZEXT464((uint)local_a0.m_floats[1]);
              in_ZMM1 = ZEXT464((uint)local_a0.m_floats[0]);
              auVar4 = vfmadd231ss_fma(ZEXT416((uint)(local_a0.m_floats[1] * v_00->m_floats[1])),
                                       ZEXT416((uint)local_a0.m_floats[0]),
                                       ZEXT416((uint)v_00->m_floats[0]));
              auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)local_a0.m_floats[2]),
                                       ZEXT416((uint)v_00->m_floats[2]));
              auVar10._8_4_ = 0x7fffffff;
              auVar10._0_8_ = 0x7fffffff7fffffff;
              auVar10._12_4_ = 0x7fffffff;
              auVar10 = vandps_avx512vl(auVar4,auVar10);
              if (1e-06 < auVar10._0_4_) {
                local_a0.m_floats[0] = local_a0.m_floats[0] * v_00->m_floats[3];
                fVar19 = -1.0 / auVar4._0_4_;
                local_a0.m_floats[1] = local_a0.m_floats[1] * v_00->m_floats[3];
                local_a0.m_floats[2] = local_a0.m_floats[2] * v_00->m_floats[3];
                local_a0.m_floats[3] = cVar20.m_floats[3];
                fVar3 = this->m_floats[3] * local_80.m_floats[0];
                local_80.m_floats[1] = this->m_floats[3] * local_80.m_floats[1];
                local_80.m_floats[0] = fVar3;
                auVar4 = vinsertps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)local_80.m_floats[1]),0x10
                                      );
                local_80.m_floats[2] = cVar6.m_floats[2];
                local_80.m_floats[2] = this->m_floats[3] * local_80.m_floats[2];
                local_80.m_floats[3] = cVar6.m_floats[3];
                fVar3 = *(float *)((long)pcVar2->m_floats + lVar9 + 0xc) * local_90.m_floats[0];
                local_90.m_floats[1] =
                     *(float *)((long)pcVar2->m_floats + lVar9 + 0xc) * local_90.m_floats[1];
                local_90.m_floats[0] = fVar3;
                local_90.m_floats[2] = cVar5.m_floats[2];
                local_90.m_floats[2] =
                     *(float *)((long)pcVar2->m_floats + lVar9 + 0xc) * local_90.m_floats[2];
                auVar10 = vinsertps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)local_90.m_floats[1]),
                                        0x10);
                fVar3 = local_90.m_floats[2] + local_80.m_floats[2] + local_a0.m_floats[2];
                in_ZMM1 = ZEXT464((uint)fVar3);
                local_90.m_floats[3] = cVar5.m_floats[3];
                auVar11._0_4_ = fVar19 * (auVar10._0_4_ + auVar4._0_4_ + local_a0.m_floats[0]);
                auVar11._4_4_ = fVar19 * (auVar10._4_4_ + auVar4._4_4_ + local_a0.m_floats[1]);
                auVar11._8_4_ = fVar19 * (auVar10._8_4_ + auVar4._8_4_ + 0.0);
                auVar11._12_4_ = fVar19 * (auVar10._12_4_ + auVar4._12_4_ + 0.0);
                local_68.m_floats._0_8_ = vmovlps_avx(auVar11);
                local_68.m_floats[3] = local_a0.m_floats[3];
                local_68.m_floats[2] = fVar19 * fVar3;
                in_ZMM0 = ZEXT464(0x3c23d70a);
                bVar7 = isPointInsidePlanes(planeEquations,&local_68,0.01);
                if (bVar7) {
                  cbtAlignedObjectArray<cbtVector3>::push_back(local_40,&local_68);
                }
              }
            }
          }
        }
        lVar9 = lVar9 + 0x10;
        uVar8 = uVar8 + 1;
      }
      uVar8 = local_6c + 1;
    }
    local_b0 = local_b0 + 1;
    local_58 = local_58 + 1;
  }
  return;
}

Assistant:

void cbtGeometryUtil::getVerticesFromPlaneEquations(const cbtAlignedObjectArray<cbtVector3>& planeEquations, cbtAlignedObjectArray<cbtVector3>& verticesOut)
{
	const int numbrushes = planeEquations.size();
	// brute force:
	for (int i = 0; i < numbrushes; i++)
	{
		const cbtVector3& N1 = planeEquations[i];

		for (int j = i + 1; j < numbrushes; j++)
		{
			const cbtVector3& N2 = planeEquations[j];

			for (int k = j + 1; k < numbrushes; k++)
			{
				const cbtVector3& N3 = planeEquations[k];

				cbtVector3 n2n3;
				n2n3 = N2.cross(N3);
				cbtVector3 n3n1;
				n3n1 = N3.cross(N1);
				cbtVector3 n1n2;
				n1n2 = N1.cross(N2);

				if ((n2n3.length2() > cbtScalar(0.0001)) &&
					(n3n1.length2() > cbtScalar(0.0001)) &&
					(n1n2.length2() > cbtScalar(0.0001)))
				{
					//point P out of 3 plane equations:

					//	d1 ( N2 * N3 ) + d2 ( N3 * N1 ) + d3 ( N1 * N2 )
					//P =  -------------------------------------------------------------------------
					//   N1 . ( N2 * N3 )

					cbtScalar quotient = (N1.dot(n2n3));
					if (cbtFabs(quotient) > cbtScalar(0.000001))
					{
						quotient = cbtScalar(-1.) / quotient;
						n2n3 *= N1[3];
						n3n1 *= N2[3];
						n1n2 *= N3[3];
						cbtVector3 potentialVertex = n2n3;
						potentialVertex += n3n1;
						potentialVertex += n1n2;
						potentialVertex *= quotient;

						//check if inside, and replace supportingVertexOut if needed
						if (isPointInsidePlanes(planeEquations, potentialVertex, cbtScalar(0.01)))
						{
							verticesOut.push_back(potentialVertex);
						}
					}
				}
			}
		}
	}
}